

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImplX11::resetVideoMode(WindowImplX11 *this)

{
  bool bVar1;
  ostream *poVar2;
  RROutput local_30;
  RROutput output;
  XRRCrtcInfo *crtcInfo;
  XRRScreenResources *res;
  int xRandRMinor;
  int xRandRMajor;
  WindowImplX11 *this_local;
  
  if ((anonymous_namespace)::fullscreenWindow != this) {
    return;
  }
  _xRandRMinor = this;
  bVar1 = checkXRandR(this,(int *)((long)&res + 4),(int *)&res);
  if (bVar1) {
    crtcInfo = (XRRCrtcInfo *)
               XRRGetScreenResources
                         (this->m_display,
                          *(undefined8 *)
                           (*(long *)(this->m_display + 0xe8) +
                            (long)*(int *)(this->m_display + 0xe0) * 0x80 + 0x10));
    if (crtcInfo == (XRRCrtcInfo *)0x0) {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,
                               "Failed to get the current screen resources to reset the video mode")
      ;
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      return;
    }
    output = XRRGetCrtcInfo(this->m_display,crtcInfo,this->m_oldRRCrtc);
    if (output == 0) {
      XRRFreeScreenResources(crtcInfo);
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Failed to get crtc info to reset the video mode");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      return;
    }
    if (((res._4_4_ == 1) && (2 < (int)res)) || (1 < res._4_4_)) {
      local_30 = XRRGetOutputPrimary(this->m_display,
                                     *(undefined8 *)
                                      (*(long *)(this->m_display + 0xe8) +
                                       (long)*(int *)(this->m_display + 0xe0) * 0x80 + 0x10));
      if (local_30 == 0) {
        local_30 = *crtcInfo->outputs;
      }
    }
    else {
      local_30 = *crtcInfo->outputs;
    }
    XRRSetCrtcConfig(this->m_display,crtcInfo,this->m_oldRRCrtc,0,*(undefined4 *)(output + 8),
                     *(undefined4 *)(output + 0xc),(long)this->m_oldVideoMode,
                     *(undefined2 *)(output + 0x20),&local_30,1);
    XRRFreeCrtcInfo(output);
    XRRFreeScreenResources(crtcInfo);
  }
  (anonymous_namespace)::fullscreenWindow = (WindowImplX11 *)0x0;
  return;
}

Assistant:

void WindowImplX11::resetVideoMode()
{
    if (fullscreenWindow == this)
    {
        // Try to set old configuration
        // Check if the XRandR extension
        int xRandRMajor, xRandRMinor;
        if (checkXRandR(xRandRMajor, xRandRMinor))
        {
            XRRScreenResources* res = XRRGetScreenResources(m_display, DefaultRootWindow(m_display));
            if (!res)
            {
                err() << "Failed to get the current screen resources to reset the video mode" << std::endl;
                return;
            }

            // Retreive current screen position and rotation
            XRRCrtcInfo* crtcInfo = XRRGetCrtcInfo(m_display, res, m_oldRRCrtc);
            if (!crtcInfo)
            {
                XRRFreeScreenResources(res);
                err() << "Failed to get crtc info to reset the video mode" << std::endl;
                return;
            }

            RROutput output;

            // if version >= 1.3 get the primary screen else take the first screen
            if ((xRandRMajor == 1 && xRandRMinor >= 3) || xRandRMajor > 1)
            {
                output = XRRGetOutputPrimary(m_display, DefaultRootWindow(m_display));

                // Check if returned output is valid, otherwise use the first screen
                if (output == None)
                    output = res->outputs[0];
            }
            else{
                output = res->outputs[0];
            }

            XRRSetCrtcConfig(m_display,
                             res,
                             m_oldRRCrtc,
                             CurrentTime,
                             crtcInfo->x,
                             crtcInfo->y,
                             m_oldVideoMode,
                             crtcInfo->rotation,
                             &output,
                             1);

            XRRFreeCrtcInfo(crtcInfo);
            XRRFreeScreenResources(res);
        }

        // Reset the fullscreen window
        fullscreenWindow = NULL;
    }
}